

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderConstBaseUri(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlTextReaderPtr pxVar2;
  int result;
  xmlChar *ret;
  xmlChar *tmp;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    tmp = (xmlChar *)reader;
    iVar1 = xmlNodeGetBaseSafe((xmlDoc *)0x0,reader->node,&ret);
    if (iVar1 < 0) {
      xmlTextReaderErrMemory((xmlTextReaderPtr)tmp);
    }
    if (ret == (xmlChar *)0x0) {
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      pxVar2 = (xmlTextReaderPtr)constString((xmlTextReaderPtr)tmp,ret);
      (*xmlFree)(ret);
      reader_local = pxVar2;
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

const xmlChar *
xmlTextReaderConstBaseUri(xmlTextReaderPtr reader) {
    xmlChar *tmp;
    const xmlChar *ret;
    int result;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    result = xmlNodeGetBaseSafe(NULL, reader->node, &tmp);
    if (result < 0)
        xmlTextReaderErrMemory(reader);
    if (tmp == NULL)
        return(NULL);
    ret = constString(reader, tmp);
    xmlFree(tmp);
    return(ret);
}